

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mult.hpp
# Opt level: O0

void add_linear_comb_weighted<double,unsigned_long,std::vector<double,std::allocator<double>>,long_double>
               (size_t *ix_arr,size_t st,size_t end,size_t col_num,double *res,double *Xc,
               unsigned_long *Xc_ind,unsigned_long *Xc_indptr,double *coef,double x_sd,double x_mean
               ,double *fill_val,MissingAction missing_action,double *buffer_arr,size_t *buffer_NAs,
               bool first_run,vector<double,_std::allocator<double>_> *w)

{
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __last;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __last_00;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __last_01;
  uint uVar1;
  int iVar2;
  long lVar3;
  double *pdVar4;
  reference pvVar5;
  reference pvVar6;
  iterator Xc_ind_00;
  iterator ix_arr_00;
  iterator st_00;
  reference pvVar7;
  ulong in_RDX;
  ulong in_RSI;
  long in_RDI;
  longdouble in_ST0;
  longdouble lVar8;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  vector<double,_std::allocator<double>_> *in_stack_00000010;
  double *in_stack_00000018;
  vector<double,_std::allocator<double>_> *in_stack_00000020;
  int in_stack_00000028;
  byte in_stack_00000040;
  vector<double,_std::allocator<double>_> *in_stack_00000048;
  size_t ix_1;
  longdouble currw;
  vector<unsigned_long,_std::allocator<unsigned_long>_> sorted_ix;
  longdouble mid_point;
  longdouble cumw;
  size_t ix;
  size_t end_new;
  size_t row;
  vector<double,_std::allocator<double>_> obs_weight;
  vector<double,_std::allocator<double>_> denseX;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this;
  undefined2 uVar9;
  undefined6 uVar10;
  undefined2 in_stack_fffffffffffffd88;
  undefined6 in_stack_fffffffffffffd8a;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffd9c;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffda0;
  unsigned_long *in_stack_fffffffffffffdb8;
  double *in_stack_fffffffffffffdc0;
  size_t in_stack_fffffffffffffdc8;
  value_type vVar11;
  size_t in_stack_fffffffffffffdd0;
  value_type vVar12;
  size_t in_stack_fffffffffffffdd8;
  size_t *in_stack_fffffffffffffde0;
  unsigned_long *in_stack_fffffffffffffdf0;
  double *in_stack_fffffffffffffdf8;
  byte local_1f1;
  undefined8 in_stack_fffffffffffffe60;
  undefined1 first_run_00;
  double in_stack_fffffffffffffe68;
  undefined1 *x_mean_00;
  double in_stack_fffffffffffffe70;
  double x_sd_00;
  double *in_stack_fffffffffffffe78;
  undefined2 in_stack_fffffffffffffe80;
  undefined2 uVar13;
  undefined6 in_stack_fffffffffffffe82;
  size_t in_stack_fffffffffffffe88;
  size_t in_stack_fffffffffffffe90;
  vector<double,_std::allocator<double>_> *end_00;
  size_t in_stack_fffffffffffffe98;
  size_t *in_stack_fffffffffffffea0;
  unsigned_long *in_stack_fffffffffffffeb0;
  unsigned_long *in_stack_fffffffffffffeb8;
  double *in_stack_fffffffffffffec0;
  double *in_stack_fffffffffffffec8;
  MissingAction in_stack_fffffffffffffed0;
  double *in_stack_fffffffffffffed8;
  double *buffer_arr_00;
  undefined2 in_stack_fffffffffffffee0;
  undefined2 uVar14;
  undefined6 in_stack_fffffffffffffee2;
  ulong local_e8;
  double local_e0;
  ulong local_d8;
  vector<double,_std::allocator<double>_> local_c8;
  undefined1 local_99;
  undefined8 local_98;
  vector<double,_std::allocator<double>_> local_90;
  byte local_71;
  double local_70;
  double local_68;
  ulong local_48;
  ulong local_40;
  long local_38;
  
  local_71 = in_stack_00000040 & 1;
  if ((local_71 == 0) || (in_stack_00000028 == 0)) {
    add_linear_comb<double,unsigned_long>
              (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
               in_stack_fffffffffffffe88,
               (double *)CONCAT62(in_stack_fffffffffffffe82,in_stack_fffffffffffffe80),
               in_stack_fffffffffffffe78,in_stack_fffffffffffffeb0,in_stack_fffffffffffffeb8,
               in_stack_fffffffffffffec0,in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
               in_stack_fffffffffffffec8,in_stack_fffffffffffffed0,in_stack_fffffffffffffed8,
               (size_t *)CONCAT62(in_stack_fffffffffffffee2,in_stack_fffffffffffffee0),
               SUB81((ulong)in_stack_fffffffffffffe60 >> 0x38,0));
  }
  else {
    lVar3 = (in_RDX - in_RSI) + 1;
    local_98 = 0;
    x_mean_00 = &local_99;
    local_70 = in_XMM1_Qa;
    local_68 = in_XMM0_Qa;
    local_48 = in_RDX;
    local_40 = in_RSI;
    local_38 = in_RDI;
    std::allocator<double>::allocator((allocator<double> *)0x41a4ce);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffda0._M_current,
               CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
               (value_type_conflict *)in_stack_fffffffffffffd90._M_current,
               (allocator_type *)CONCAT62(in_stack_fffffffffffffd8a,in_stack_fffffffffffffd88));
    std::allocator<double>::~allocator((allocator<double> *)0x41a502);
    pdVar4 = std::vector<double,_std::allocator<double>_>::data
                       ((vector<double,_std::allocator<double>_> *)0x41a57f);
    uVar9 = SUB82(pdVar4,0);
    uVar10 = (undefined6)((ulong)pdVar4 >> 0x10);
    todense<double,unsigned_long>
              (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,
               in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
               in_stack_fffffffffffffdf0,in_stack_fffffffffffffdf8);
    std::allocator<double>::allocator((allocator<double> *)0x41a5fe);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffda0._M_current,
               CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
               (allocator_type *)in_stack_fffffffffffffd90._M_current);
    std::allocator<double>::~allocator((allocator<double> *)0x41a62a);
    for (local_d8 = local_40; local_d8 <= local_48; local_d8 = local_d8 + 1) {
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         (in_stack_00000048,*(size_type *)(local_38 + local_d8 * 8));
      vVar12 = *pvVar5;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&local_c8,local_d8 - local_40);
      *pvVar5 = vVar12;
    }
    local_e0 = (double)((local_48 - local_40) + 1);
    for (local_e8 = 0; local_e8 < (local_48 - local_40) + 1; local_e8 = local_e8 + 1) {
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&local_90,local_e8);
      uVar1 = std::isnan(*pvVar5);
      local_1f1 = 1;
      if ((uVar1 & 1) == 0) {
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&local_90,local_e8);
        iVar2 = std::isinf(*pvVar5);
        local_1f1 = (byte)iVar2;
      }
      if ((local_1f1 & 1) != 0) {
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&local_90,local_e8);
        local_e0 = (double)((long)local_e0 - 1);
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&local_90,(size_type)local_e0);
        std::swap<double>(pvVar5,pvVar6);
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&local_c8,local_e8);
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&local_c8,(size_type)local_e0);
        std::swap<double>(pvVar5,pvVar6);
      }
    }
    std::vector<double,_std::allocator<double>_>::begin(in_stack_00000010);
    std::vector<double,_std::allocator<double>_>::begin(in_stack_00000010);
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::operator+
              ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
               CONCAT62(in_stack_fffffffffffffd8a,in_stack_fffffffffffffd88),CONCAT62(uVar10,uVar9))
    ;
    this = SUB108((longdouble)0,0);
    uVar9 = (undefined2)((unkuint10)(longdouble)0 >> 0x40);
    __last_00._M_current._4_4_ = in_stack_fffffffffffffd9c;
    __last_00._M_current._0_4_ = in_stack_fffffffffffffd98;
    std::
    accumulate<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,long_double>
              (in_stack_fffffffffffffda0,__last_00,
               (longdouble)CONCAT28(in_stack_fffffffffffffd88,CONCAT62(uVar10,uVar9)));
    buffer_arr_00 = SUB108((longdouble)0.5 * in_ST0,0);
    uVar14 = (undefined2)((unkuint10)((longdouble)0.5 * in_ST0) >> 0x40);
    std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x41a922);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               in_stack_fffffffffffffda0._M_current,
               CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
               (allocator_type *)in_stack_fffffffffffffd90._M_current);
    std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x41a948);
    Xc_ind_00 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(this);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(this);
    __last._M_current._2_6_ = in_stack_fffffffffffffd8a;
    __last._M_current._0_2_ = in_stack_fffffffffffffd88;
    std::
    iota<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long>
              (in_stack_fffffffffffffd90,__last,CONCAT62(uVar10,uVar9));
    ix_arr_00 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(this);
    st_00 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(this);
    end_00 = &local_90;
    __last_01._M_current._4_4_ = in_stack_fffffffffffffd9c;
    __last_01._M_current._0_4_ = in_stack_fffffffffffffd98;
    std::
    sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,add_linear_comb_weighted<double,unsigned_long,std::vector<double,std::allocator<double>>,long_double>(unsigned_long_const*,unsigned_long,unsigned_long,unsigned_long,double*,double_const*,unsigned_long_const*,unsigned_long_const*,double&,double,double,double&,MissingAction,double*,unsigned_long*,bool,std::vector<double,std::allocator<double>>&)::_lambda(unsigned_long,unsigned_long)_1_>
              ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )in_stack_fffffffffffffda0._M_current,__last_01,
               (anon_class_8_1_518b9257)in_stack_fffffffffffffd90._M_current);
    pdVar4 = SUB108((longdouble)0,0);
    uVar13 = (undefined2)((unkuint10)(longdouble)0 >> 0x40);
    pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                        CONCAT62(uVar10,uVar9));
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&local_90,*pvVar7);
    (in_stack_00000020->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)*pvVar5;
    for (x_sd_00 = 0.0; first_run_00 = (undefined1)((ulong)lVar3 >> 0x38),
        (ulong)x_sd_00 < (ulong)local_e0; x_sd_00 = (double)((long)x_sd_00 + 1)) {
      pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          &stack0xfffffffffffffec0,(size_type)x_sd_00);
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&local_c8,*pvVar7);
      first_run_00 = (undefined1)((ulong)lVar3 >> 0x38);
      lVar8 = (longdouble)CONCAT28(uVar13,pdVar4) + (longdouble)*pvVar5;
      pdVar4 = SUB108(lVar8,0);
      uVar13 = (undefined2)((unkuint10)lVar8 >> 0x40);
      if ((longdouble)CONCAT28(uVar14,buffer_arr_00) <= lVar8) {
        if (((lVar8 != (longdouble)CONCAT28(uVar14,buffer_arr_00)) ||
            (NAN(lVar8) || NAN((longdouble)CONCAT28(uVar14,buffer_arr_00)))) ||
           ((long)local_e0 - 1U <= (ulong)x_sd_00)) {
          pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                              &stack0xfffffffffffffec0,(size_type)x_sd_00);
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&local_90,*pvVar7);
          (in_stack_00000020->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_start = (pointer)*pvVar5;
        }
        else {
          pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                              &stack0xfffffffffffffec0,(size_type)x_sd_00);
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&local_90,*pvVar7);
          vVar12 = *pvVar5;
          pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                              &stack0xfffffffffffffec0,(long)x_sd_00 + 1);
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&local_90,*pvVar7);
          vVar11 = *pvVar5;
          pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                              &stack0xfffffffffffffec0,(size_type)x_sd_00);
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&local_90,*pvVar7);
          (in_stack_00000020->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_start = (pointer)(vVar12 + (vVar11 - *pvVar5) / 2.0);
        }
        break;
      }
    }
    (in_stack_00000020->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)(((double)(in_stack_00000020->super__Vector_base<double,_std::allocator<double>_>)
                            ._M_impl.super__Vector_impl_data._M_start - local_70) *
                  (*in_stack_00000018 / local_68));
    std::vector<double,_std::allocator<double>_>::clear
              ((vector<double,_std::allocator<double>_> *)0x41ac67);
    std::vector<double,_std::allocator<double>_>::clear
              ((vector<double,_std::allocator<double>_> *)0x41ac74);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x41ac81);
    add_linear_comb<double,unsigned_long>
              (ix_arr_00._M_current,(size_t)st_00._M_current,(size_t)end_00,
               in_stack_fffffffffffffe88,(double *)CONCAT62(in_stack_fffffffffffffe82,uVar13),pdVar4
               ,Xc_ind_00._M_current,in_stack_fffffffffffffeb8,in_stack_fffffffffffffec0,x_sd_00,
               (double)x_mean_00,in_stack_fffffffffffffec8,in_stack_fffffffffffffed0,buffer_arr_00,
               (size_t *)CONCAT62(in_stack_fffffffffffffee2,uVar14),(bool)first_run_00);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_00000020);
    std::vector<double,_std::allocator<double>_>::~vector(in_stack_00000020);
    std::vector<double,_std::allocator<double>_>::~vector(in_stack_00000020);
  }
  return;
}

Assistant:

void add_linear_comb_weighted(const size_t *restrict ix_arr, size_t st, size_t end, size_t col_num, double *restrict res,
                              const real_t_ *restrict Xc, const sparse_ix *restrict Xc_ind, const sparse_ix *restrict Xc_indptr,
                              double &restrict coef, double x_sd, double x_mean, double &restrict fill_val, MissingAction missing_action,
                              double *restrict buffer_arr, size_t *restrict buffer_NAs, bool first_run, mapping &restrict w)
{
    /* TODO: there's likely a better way of doing this directly with sparse inputs.
       Think about some way of doing it efficiently. */
    if (first_run && missing_action != Fail)
    {
        std::vector<double> denseX(end-st+1, 0.);
        todense(ix_arr, st, end,
                col_num, Xc, Xc_ind, Xc_indptr,
                denseX.data());
        std::vector<double> obs_weight(end-st+1);
        for (size_t row = st; row <= end; row++)
            obs_weight[row - st] = w[ix_arr[row]];

        size_t end_new = end - st + 1;
        for (size_t ix = 0; ix < end-st+1; ix++)
        {
            if (unlikely(is_na_or_inf(denseX[ix])))
            {
                std::swap(denseX[ix], denseX[--end_new]);
                std::swap(obs_weight[ix], obs_weight[end_new]);
            }
        }

        ldouble_safe cumw = std::accumulate(obs_weight.begin(), obs_weight.begin() + end_new, (ldouble_safe)0);
        ldouble_safe mid_point = cumw / (ldouble_safe)2;
        std::vector<size_t> sorted_ix(end_new);
        std::iota(sorted_ix.begin(), sorted_ix.end(), (size_t)0);
        std::sort(sorted_ix.begin(), sorted_ix.end(),
                  [&denseX](const size_t a, const size_t b){return denseX[a] < denseX[b];});
        ldouble_safe currw = 0;
        fill_val = denseX[sorted_ix.back()]; /* <- will overwrite later */
        /* TODO: is this median calculation correct? should it do a weighted interpolation? */
        for (size_t ix = 0; ix < end_new; ix++)
        {
            currw += obs_weight[sorted_ix[ix]];
            if (currw >= mid_point)
            {
                if (currw == mid_point && ix < end_new-1)
                    fill_val = denseX[sorted_ix[ix]] + (denseX[sorted_ix[ix+1]] - denseX[sorted_ix[ix]]) / 2.0;
                else
                    fill_val = denseX[sorted_ix[ix]];
                break;
            }
        }

        fill_val = (fill_val - x_mean) * (coef / x_sd);
        denseX.clear();
        obs_weight.clear();
        sorted_ix.clear();
        
        add_linear_comb(ix_arr, st, end, col_num, res,
                        Xc, Xc_ind, Xc_indptr,
                        coef, x_sd, x_mean, fill_val, missing_action,
                        buffer_arr, buffer_NAs, false);
    }

    else
    {
        add_linear_comb(ix_arr, st, end, col_num, res,
                        Xc, Xc_ind, Xc_indptr,
                        coef, x_sd, x_mean, fill_val, missing_action,
                        buffer_arr, buffer_NAs, first_run);
    }
}